

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpool.h
# Opt level: O0

int __thiscall CVmPoolInMem::get_ofs(CVmPoolInMem *this,char *p,pool_ofs_t *ofs)

{
  char *pcVar1;
  char *mem;
  size_t i;
  pool_ofs_t page_ofs;
  pool_ofs_t *ofs_local;
  char *p_local;
  CVmPoolInMem *this_local;
  
  page_ofs = 0;
  i = 0;
  while( true ) {
    if ((this->super_CVmPoolPaged).page_slots_ <= i) {
      return 0;
    }
    pcVar1 = (this->super_CVmPoolPaged).pages_[i].mem;
    if ((pcVar1 <= p) && (p < pcVar1 + (this->super_CVmPoolPaged).pages_[i].siz)) break;
    i = i + 1;
    page_ofs = page_ofs + (int)(this->super_CVmPoolPaged).super_CVmPool.page_size_;
  }
  *ofs = ((int)p - (int)pcVar1) + page_ofs;
  return 1;
}

Assistant:

inline int get_ofs(const char *p, pool_ofs_t *ofs)
    {
        /* check each page */
        pool_ofs_t page_ofs = 0;
        for (size_t i = 0 ; i < page_slots_ ; ++i, page_ofs += page_size_)
        {
            /* if it's in this page, it's a valid address */
            const char *mem = pages_[i].mem;
            if (p >= mem && p < mem + pages_[i].siz)
            {
                *ofs = (p - mem) + page_ofs;
                return TRUE;
            }
        }

        /* didn't find it */
        return FALSE;
    }